

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsSetIndexedPropertiesToExternalData
          (JsValueRef object,void *data,JsTypedArrayType arrayType,uint elementLength)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  ArrayObject *objArray;
  DynamicObject *this;
  Type typeId;
  JsErrorCode JVar8;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_a8 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x9d2,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_0037a36d;
    *puVar6 = 0;
  }
  if (object != (JsValueRef)0x0) {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      JVar8 = JsErrorArgumentNotObject;
      goto switchD_0037a2df_default;
    }
    pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 == scriptContext) {
LAB_0037a0c3:
      if (((ulong)object & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)object & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_0037a36d;
        typeId = TypeIds_FirstNumberType;
        goto LAB_0037a14d;
      }
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)object & 0xffff000000000000) != 0x1000000000000) &&
         (typeId = TypeIds_Number, (ulong)object >> 0x32 == 0)) goto LAB_0037a1eb;
    }
    else {
      JVar8 = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto switchD_0037a2df_default;
      object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
      if (object != (Var)0x0) goto LAB_0037a0c3;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0037a36d;
      *puVar6 = 0;
      object = (Var)0x0;
LAB_0037a1eb:
      pRVar7 = Js::UnsafeVarTo<Js::RecyclableObject>(object);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_0037a36d;
        *puVar6 = 0;
      }
      typeId = ((pRVar7->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar4 = Js::RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_0037a36d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
LAB_0037a14d:
        *puVar6 = 0;
      }
    }
    bVar3 = Js::DynamicType::Is(typeId);
    if (((bVar3) && (bVar3 = Js::DynamicObject::IsAnyArrayTypeId(typeId), !bVar3)) &&
       (typeId != TypeIds_DataView && 0xd < typeId - TypeIds_ArrayBuffer)) {
      pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
      BVar4 = Js::RecyclableObject::IsExternal(pRVar7);
      if ((BVar4 == 0) && (data != (void *)0x0 || elementLength == 0)) {
        JVar8 = JsErrorInvalidArgument;
        switch(arrayType) {
        case JsArrayTypeInt8:
          objArray = CreateTypedArray<char,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeUint8:
          objArray = CreateTypedArray<unsigned_char,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeUint8Clamped:
          objArray = CreateTypedArray<unsigned_char,true>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeInt16:
          objArray = CreateTypedArray<short,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeUint16:
          objArray = CreateTypedArray<unsigned_short,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeInt32:
          objArray = CreateTypedArray<int,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeUint32:
          objArray = CreateTypedArray<unsigned_int,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeFloat32:
          objArray = CreateTypedArray<float,false>(scriptContext,data,elementLength);
          break;
        case JsArrayTypeFloat64:
          objArray = CreateTypedArray<double,false>(scriptContext,data,elementLength);
          break;
        default:
          goto switchD_0037a2df_default;
        }
        this = Js::VarTo<Js::DynamicObject>(object);
        JVar8 = JsNoError;
        Js::DynamicObject::SetObjectArray(this,objArray);
        goto switchD_0037a2df_default;
      }
    }
  }
  JVar8 = JsErrorInvalidArgument;
switchD_0037a2df_default:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar8;
}

Assistant:

CHAKRA_API JsSetIndexedPropertiesToExternalData(
    _In_ JsValueRef object,
    _In_ void* data,
    _In_ JsTypedArrayType arrayType,
    _In_ unsigned int elementLength)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);

        // Don't support doing this on array or array-like object
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(object);
        if (!Js::DynamicType::Is(typeId)
            || Js::DynamicObject::IsAnyArrayTypeId(typeId)
            || (typeId >= Js::TypeIds_TypedArrayMin && typeId <= Js::TypeIds_TypedArrayMax)
            || typeId == Js::TypeIds_ArrayBuffer
            || typeId == Js::TypeIds_DataView
            || Js::VarTo<Js::RecyclableObject>(object)->IsExternal()
            )
        {
            return JsErrorInvalidArgument;
        }

        if (data == nullptr && elementLength > 0)
        {
            return JsErrorInvalidArgument;
        }

        Js::ArrayObject* newTypedArray = nullptr;
        switch (arrayType)
        {
        case JsArrayTypeInt8:
            newTypedArray = CreateTypedArray<int8>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint8:
            newTypedArray = CreateTypedArray<uint8>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint8Clamped:
            newTypedArray = CreateTypedArray<uint8, true>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeInt16:
            newTypedArray = CreateTypedArray<int16>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint16:
            newTypedArray = CreateTypedArray<uint16>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeInt32:
            newTypedArray = CreateTypedArray<int32>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeUint32:
            newTypedArray = CreateTypedArray<uint32>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeFloat32:
            newTypedArray = CreateTypedArray<float>(scriptContext, data, elementLength);
            break;
        case JsArrayTypeFloat64:
            newTypedArray = CreateTypedArray<double>(scriptContext, data, elementLength);
            break;
        default:
            return JsErrorInvalidArgument;
        }

        Js::DynamicObject* dynamicObject = Js::VarTo<Js::DynamicObject>(object);
        dynamicObject->SetObjectArray(newTypedArray);

        return JsNoError;
    });
}